

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFileSize(sqlite3_file *id,i64 *pSize)

{
  int iVar1;
  int *piVar2;
  long *in_RSI;
  unixFile *in_RDI;
  long in_FS_OFFSET;
  int rc;
  stat buf;
  int local_9c;
  undefined1 local_98 [48];
  long local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_98,0xaa,0x90);
  iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)in_RDI->h,local_98);
  if (iVar1 == 0) {
    *in_RSI = local_68;
    if (*in_RSI == 1) {
      *in_RSI = 0;
    }
    local_9c = 0;
  }
  else {
    piVar2 = __errno_location();
    storeLastErrno(in_RDI,*piVar2);
    local_9c = 0x70a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_9c;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFileSize(sqlite3_file *id, i64 *pSize){
  int rc;
  struct stat buf;
  assert( id );
  rc = osFstat(((unixFile*)id)->h, &buf);
  SimulateIOError( rc=1 );
  if( rc!=0 ){
    storeLastErrno((unixFile*)id, errno);
    return SQLITE_IOERR_FSTAT;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;


  return SQLITE_OK;
}